

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O3

Reader __thiscall
capnp::_::PointerReader::getBlob<capnp::Data>
          (PointerReader *this,void *defaultValue,ByteCount defaultSize)

{
  word *pwVar1;
  Arena *pAVar2;
  ulong uVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ulong uVar6;
  WirePointer *pWVar7;
  uint uVar8;
  ByteCount BVar9;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  WirePointer *pWVar13;
  WirePointer *pWVar14;
  WirePointer *pWVar15;
  Reader RVar16;
  ThrowOverflow local_29;
  SegmentReader *pSVar5;
  
  pSVar5 = this->segment;
  pWVar13 = (WirePointer *)&(anonymous_namespace)::zero;
  if (this->pointer != (WirePointer *)0x0) {
    pWVar13 = this->pointer;
  }
  if (0x1fffffff < defaultSize) {
    kj::ThrowOverflow::operator()(&local_29);
  }
  pWVar15 = (WirePointer *)defaultValue;
  BVar9 = defaultSize;
  if (pSVar5 == (SegmentReader *)0x0) {
    uVar8 = (uint)*(uint64_t *)&(pWVar13->offsetAndKind).value;
    if ((pWVar13->field_1).upper32Bits == 0 && uVar8 == 0) goto LAB_0014d3f6;
    pWVar7 = pWVar13 + (long)((int)uVar8 >> 2) + 1;
    pSVar5 = (SegmentReader *)0x0;
  }
  else {
    uVar8 = (uint)*(uint64_t *)&(pWVar13->offsetAndKind).value;
    if ((pWVar13->field_1).upper32Bits == 0 && uVar8 == 0) goto LAB_0014d3f6;
    pwVar1 = (pSVar5->ptr).ptr;
    pWVar14 = (WirePointer *)(pwVar1 + (pSVar5->ptr).size_);
    lVar11 = (long)((int)uVar8 >> 2);
    pWVar7 = pWVar13 + lVar11 + 1;
    if ((long)pWVar14 - (long)(pWVar13 + 1) >> 3 < lVar11) {
      pWVar7 = pWVar14;
    }
    if (lVar11 < (long)pwVar1 - (long)(pWVar13 + 1) >> 3) {
      pWVar7 = pWVar14;
    }
    if ((uVar8 & 3) == 2) {
      iVar4 = (*pSVar5->arena->_vptr_Arena[2])();
      pSVar5 = (SegmentReader *)CONCAT44(extraout_var,iVar4);
      if (pSVar5 == (SegmentReader *)0x0) {
        getBlob<capnp::Data>();
        goto LAB_0014d3f6;
      }
      uVar10 = (pSVar5->ptr).size_;
      uVar8 = (uint)*(uint64_t *)&(pWVar13->offsetAndKind).value;
      uVar6 = (ulong)(uVar8 >> 3);
      if ((long)uVar10 < (long)(ulong)(uVar8 >> 3)) {
        uVar6 = uVar10;
      }
      uVar12 = 2 - (ulong)((uVar8 & 4) == 0);
      if (uVar6 + uVar12 <= uVar10) {
        pwVar1 = (pSVar5->ptr).ptr;
        pAVar2 = pSVar5->arena;
        uVar3 = pSVar5->readLimiter->limit;
        if (uVar12 <= uVar3) {
          pWVar14 = (WirePointer *)(pwVar1 + uVar6);
          pWVar13 = pWVar14 + 1;
          pSVar5->readLimiter->limit = uVar3 - uVar12;
          if ((uVar8 & 4) != 0) {
            iVar4 = (*pAVar2->_vptr_Arena[2])(pAVar2,(ulong)(pWVar14->field_1).upper32Bits);
            pSVar5 = (SegmentReader *)CONCAT44(extraout_var_00,iVar4);
            if (pSVar5 == (SegmentReader *)0x0) {
              getBlob<capnp::Data>();
              goto LAB_0014d3f6;
            }
            uVar8 = (uint)*(uint64_t *)&(pWVar14->offsetAndKind).value;
            if ((uVar8 & 3) != 2) {
              getBlob<capnp::Data>();
              goto LAB_0014d3f6;
            }
            uVar6 = (ulong)(uVar8 >> 3);
            uVar10 = (pSVar5->ptr).size_;
            if ((long)uVar10 < (long)uVar6) {
              uVar6 = uVar10;
            }
            pWVar7 = (WirePointer *)((pSVar5->ptr).ptr + uVar6);
            goto LAB_0014d39d;
          }
          uVar8 = (uint)*(uint64_t *)&(pWVar14->offsetAndKind).value;
          lVar11 = (long)((int)uVar8 >> 2);
          pWVar7 = (WirePointer *)(pwVar1 + uVar10);
          if (((long)pwVar1 - (long)pWVar13 >> 3 <= lVar11) &&
             (lVar11 <= (long)pWVar7 - (long)pWVar13 >> 3)) {
            pWVar7 = pWVar13 + lVar11;
            pWVar13 = pWVar14;
            goto LAB_0014d3a6;
          }
          goto LAB_0014d3a2;
        }
        (*pAVar2->_vptr_Arena[3])();
      }
      getBlob<capnp::Data>();
      goto LAB_0014d3f6;
    }
LAB_0014d39d:
    pWVar14 = pWVar13;
    if (pWVar7 == (WirePointer *)0x0) goto LAB_0014d3f6;
LAB_0014d3a2:
    uVar8 = (uint)*(uint64_t *)&(pWVar14->offsetAndKind).value;
    pWVar13 = pWVar14;
  }
LAB_0014d3a6:
  if ((uVar8 & 3) == 1) {
    if (((pWVar13->field_1).upper32Bits & 7) == 2) {
      BVar9 = (pWVar13->field_1).upper32Bits >> 3;
      pWVar15 = pWVar7;
      if (pSVar5 != (SegmentReader *)0x0) {
        uVar10 = (ulong)(BVar9 + 7 >> 3);
        if (((long)pWVar7 - (long)(pSVar5->ptr).ptr >> 3) + uVar10 <= (pSVar5->ptr).size_) {
          uVar6 = pSVar5->readLimiter->limit;
          if (uVar10 <= uVar6) {
            pSVar5->readLimiter->limit = uVar6 - uVar10;
            goto LAB_0014d3f6;
          }
          (*pSVar5->arena->_vptr_Arena[3])();
        }
        getBlob<capnp::Data>();
        pWVar15 = (WirePointer *)defaultValue;
        BVar9 = defaultSize;
      }
    }
    else {
      getBlob<capnp::Data>();
    }
  }
  else {
    getBlob<capnp::Data>();
  }
LAB_0014d3f6:
  RVar16.super_ArrayPtr<const_unsigned_char>.size_._0_4_ = BVar9;
  RVar16.super_ArrayPtr<const_unsigned_char>.ptr = (uchar *)pWVar15;
  RVar16.super_ArrayPtr<const_unsigned_char>.size_._4_4_ = 0;
  return (Reader)RVar16.super_ArrayPtr<const_unsigned_char>;
}

Assistant:

Data::Reader PointerReader::getBlob<Data>(const void* defaultValue, ByteCount defaultSize) const {
  const WirePointer* ref = pointer == nullptr ? &zero.pointer : pointer;
  return WireHelpers::readDataPointer(segment, ref, defaultValue,
      assertMaxBits<BLOB_SIZE_BITS>(defaultSize, ThrowOverflow()));
}